

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

size_t rtc::utf8_decode(char *source,size_t srclen,unsigned_long *value)

{
  ulong uVar1;
  unsigned_long value16;
  uchar *s;
  unsigned_long *value_local;
  size_t srclen_local;
  char *source_local;
  
  if ((*source & 0x80U) == 0) {
    *value = (ulong)(byte)*source;
    source_local = (char *)0x1;
  }
  else if ((srclen < 2) || ((source[1] & 0xc0U) != 0x80)) {
    source_local = (char *)0x0;
  }
  else if ((*source & 0xe0U) == 0xc0) {
    *value = (long)(int)(((byte)*source & 0x1f) << 6 | (byte)source[1] & 0x3f);
    source_local = (char *)0x2;
  }
  else if ((srclen < 3) || ((source[2] & 0xc0U) != 0x80)) {
    source_local = (char *)0x0;
  }
  else {
    uVar1 = (long)(int)((byte)source[1] & 0x3f) << 6 | (long)(int)((byte)source[2] & 0x3f);
    if ((*source & 0xf0U) == 0xe0) {
      *value = (long)(int)(((byte)*source & 0xf) << 0xc) | uVar1;
      source_local = (char *)0x3;
    }
    else if ((srclen < 4) || ((source[3] & 0xc0U) != 0x80)) {
      source_local = (char *)0x0;
    }
    else if ((*source & 0xf8U) == 0xf0) {
      *value = (long)(int)(((byte)*source & 7) << 0x12) |
               uVar1 << 6 | (long)(int)((byte)source[3] & 0x3f);
      source_local = (char *)0x4;
    }
    else {
      source_local = (char *)0x0;
    }
  }
  return (size_t)source_local;
}

Assistant:

size_t utf8_decode(const char* source, size_t srclen, unsigned long* value) {
  const unsigned char* s = reinterpret_cast<const unsigned char*>(source);
  if ((s[0] & 0x80) == 0x00) {                    // Check s[0] == 0xxxxxxx
    *value = s[0];
    return 1;
  }
  if ((srclen < 2) || ((s[1] & 0xC0) != 0x80)) {  // Check s[1] != 10xxxxxx
    return 0;
  }
  // Accumulate the trailer byte values in value16, and combine it with the
  // relevant bits from s[0], once we've determined the sequence length.
  unsigned long value16 = (s[1] & 0x3F);
  if ((s[0] & 0xE0) == 0xC0) {                    // Check s[0] == 110xxxxx
    *value = ((s[0] & 0x1F) << 6) | value16;
    return 2;
  }
  if ((srclen < 3) || ((s[2] & 0xC0) != 0x80)) {  // Check s[2] != 10xxxxxx
    return 0;
  }
  value16 = (value16 << 6) | (s[2] & 0x3F);
  if ((s[0] & 0xF0) == 0xE0) {                    // Check s[0] == 1110xxxx
    *value = ((s[0] & 0x0F) << 12) | value16;
    return 3;
  }
  if ((srclen < 4) || ((s[3] & 0xC0) != 0x80)) {  // Check s[3] != 10xxxxxx
    return 0;
  }
  value16 = (value16 << 6) | (s[3] & 0x3F);
  if ((s[0] & 0xF8) == 0xF0) {                    // Check s[0] == 11110xxx
    *value = ((s[0] & 0x07) << 18) | value16;
    return 4;
  }
  return 0;
}